

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
::moveFromSpan(Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
               *this,Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                     *fromSpan,size_t fromIndex,size_t to)

{
  Entry *pEVar1;
  undefined8 *puVar2;
  byte bVar3;
  long lVar4;
  Entry *pEVar5;
  undefined8 uVar6;
  Entry *pEVar7;
  Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_> SVar8;
  ulong uVar9;
  
  SVar8 = this[0x89];
  if (SVar8 == this[0x88]) {
    addStorage(this);
    SVar8 = this[0x89];
  }
  this[to] = SVar8;
  lVar4 = *(long *)(this + 0x80);
  uVar9 = (ulong)(byte)this[0x89];
  this[0x89] = *(Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
                 *)(lVar4 + uVar9 * 0x28);
  bVar3 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar5 = fromSpan->entries;
  pEVar1 = pEVar5 + bVar3;
  *(undefined8 *)(lVar4 + uVar9 * 0x28) = *(undefined8 *)(pEVar1->storage).data;
  puVar2 = (undefined8 *)(lVar4 + 8 + uVar9 * 0x28);
  *puVar2 = 0;
  puVar2[1] = 0;
  *(undefined8 *)(lVar4 + 0x18 + uVar9 * 0x28) = 0;
  *(undefined8 *)(lVar4 + 0x20 + uVar9 * 0x28) = *(undefined8 *)((pEVar1->storage).data + 0x20);
  if (*(long *)((pEVar1->storage).data + 0x18) != 0) {
    lVar4 = lVar4 + uVar9 * 0x28;
    pEVar7 = pEVar5 + bVar3;
    uVar6 = *(undefined8 *)((pEVar1->storage).data + 0x10);
    *(undefined8 *)(lVar4 + 8) = *(undefined8 *)((pEVar1->storage).data + 8);
    *(undefined8 *)(lVar4 + 0x10) = uVar6;
    *(undefined8 *)(lVar4 + 0x18) = *(undefined8 *)((pEVar1->storage).data + 0x18);
    (pEVar7->storage).data[0x18] = '\0';
    (pEVar7->storage).data[0x19] = '\0';
    (pEVar7->storage).data[0x1a] = '\0';
    (pEVar7->storage).data[0x1b] = '\0';
    (pEVar7->storage).data[0x1c] = '\0';
    (pEVar7->storage).data[0x1d] = '\0';
    (pEVar7->storage).data[0x1e] = '\0';
    (pEVar7->storage).data[0x1f] = '\0';
    pEVar5 = pEVar5 + bVar3;
    (pEVar5->storage).data[0x20] = '\0';
    (pEVar5->storage).data[0x21] = '\0';
    (pEVar5->storage).data[0x22] = '\0';
    (pEVar5->storage).data[0x23] = '\0';
    (pEVar5->storage).data[0x24] = '\0';
    (pEVar5->storage).data[0x25] = '\0';
    (pEVar5->storage).data[0x26] = '\0';
    (pEVar5->storage).data[0x27] = '\0';
  }
  (pEVar1->storage).data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar3;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }